

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atcp.c
# Opt level: O0

void nn_atcp_start(nn_atcp *self,nn_usock *listener)

{
  nn_usock *in_RSI;
  long in_RDI;
  nn_fsm_owner *in_stack_ffffffffffffffe8;
  
  if (*(int *)(in_RDI + 0x58) != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x58),
            "NN_ATCP_STATE_IDLE",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
            ,0x5e);
    fflush(_stderr);
    nn_err_abort();
  }
  *(nn_usock **)(in_RDI + 0x2c8) = in_RSI;
  *(undefined4 *)(in_RDI + 0x2d0) = 3;
  *(long *)(in_RDI + 0x2d8) = in_RDI;
  nn_usock_swap_owner(in_RSI,in_stack_ffffffffffffffe8);
  nn_fsm_start((nn_fsm *)0x167417);
  return;
}

Assistant:

void nn_atcp_start (struct nn_atcp *self, struct nn_usock *listener)
{
    nn_assert_state (self, NN_ATCP_STATE_IDLE);

    /*  Take ownership of the listener socket. */
    self->listener = listener;
    self->listener_owner.src = NN_ATCP_SRC_LISTENER;
    self->listener_owner.fsm = &self->fsm;
    nn_usock_swap_owner (listener, &self->listener_owner);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);
}